

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O2

void __thiscall
irr::scene::CSkinnedMesh::skinJoint(CSkinnedMesh *this,SJoint *joint,SJoint *parentJoint)

{
  undefined1 *puVar1;
  vector3df *in;
  float fVar2;
  array<irr::scene::SSkinMeshBuffer_*> *paVar3;
  pointer pSVar4;
  char *pcVar5;
  SSkinMeshBuffer *pSVar6;
  pointer ppSVar7;
  long lVar8;
  vector3d<float> *this_00;
  undefined8 *puVar9;
  SJoint *parentJoint_00;
  SJoint *extraout_RDX;
  long lVar10;
  u32 i;
  ulong uVar11;
  vector3d<float> local_c8;
  vector3df local_b8;
  vector3df local_a8;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  matrix4 jointVertexPull;
  
  lVar8 = (long)(joint->Weights).m_data.
                super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(joint->Weights).m_data.
                super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((int)(lVar8 / 0x30) != 0) {
    core::CMatrix4<float>::setbyproduct_nocheck
              (&jointVertexPull,&joint->GlobalAnimatedMatrix,&joint->GlobalInversedMatrix);
    local_a8.X = 0.0;
    local_a8.Y = 0.0;
    local_a8.Z = 0.0;
    local_b8.X = 0.0;
    local_b8.Y = 0.0;
    local_b8.Z = 0.0;
    paVar3 = this->SkinningBuffers;
    lVar10 = 0x18;
    uVar11 = 0;
    while( true ) {
      pSVar4 = (joint->Weights).m_data.
               super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)(joint->Weights).m_data.
                    super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar4;
      if ((lVar8 / 0x30 & 0xffffffffU) <= uVar11) break;
      in = (vector3df *)((long)&pSVar4->buffer_id + lVar10);
      core::CMatrix4<float>::transformVect(&jointVertexPull,&local_a8,in);
      if (this->AnimateNormals == true) {
        core::CMatrix4<float>::rotateVect
                  (&jointVertexPull,&local_b8,(vector3df *)(&pSVar4->field_0xc + lVar10));
      }
      pcVar5 = *(char **)((long)pSVar4 + lVar10 + -8);
      if (*pcVar5 == '\0') {
        *pcVar5 = '\x01';
        fVar2 = *(float *)((long)pSVar4 + lVar10 + -0x10);
        local_88 = CONCAT44(fVar2 * local_a8.Y,fVar2 * local_a8.X);
        uStack_80 = 0;
        local_98 = ZEXT416((uint)(fVar2 * local_a8.Z));
        pSVar6 = (paVar3->m_data).
                 super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(ushort *)((long)pSVar4 + lVar10 + -0x18)];
        puVar9 = (undefined8 *)
                 (**(code **)((long)(pSVar6->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                           (pSVar6,*(undefined4 *)((long)pSVar4 + lVar10 + -0x14));
        *puVar9 = local_88;
        *(undefined4 *)(puVar9 + 1) = local_98._0_4_;
        if (this->AnimateNormals == true) {
          fVar2 = *(float *)((long)pSVar4 + lVar10 + -0x10);
          local_88 = CONCAT44(fVar2 * local_b8.Y,fVar2 * local_b8.X);
          uStack_80 = 0;
          local_98 = ZEXT416((uint)(fVar2 * local_b8.Z));
          pSVar6 = (paVar3->m_data).
                   super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(ushort *)((long)pSVar4 + lVar10 + -0x18)];
          lVar8 = (**(code **)((long)(pSVar6->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                            (pSVar6,*(undefined4 *)((long)pSVar4 + lVar10 + -0x14));
          *(undefined8 *)(lVar8 + 0xc) = local_88;
          *(undefined4 *)(lVar8 + 0x14) = local_98._0_4_;
        }
      }
      else {
        fVar2 = *(float *)((long)pSVar4 + lVar10 + -0x10);
        local_c8.Z = fVar2 * local_a8.Z;
        local_c8.Y = fVar2 * local_a8.Y;
        local_c8.X = fVar2 * local_a8.X;
        pSVar6 = (paVar3->m_data).
                 super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(ushort *)((long)pSVar4 + lVar10 + -0x18)];
        this_00 = (vector3d<float> *)
                  (**(code **)((long)(pSVar6->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                            (pSVar6,*(undefined4 *)((long)pSVar4 + lVar10 + -0x14));
        core::vector3d<float>::operator+=(this_00,&local_c8);
        if (this->AnimateNormals == true) {
          fVar2 = *(float *)((long)pSVar4 + lVar10 + -0x10);
          local_c8.Z = fVar2 * local_b8.Z;
          local_c8.Y = fVar2 * local_b8.Y;
          local_c8.X = fVar2 * local_b8.X;
          pSVar6 = (paVar3->m_data).
                   super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(ushort *)((long)pSVar4 + lVar10 + -0x18)];
          lVar8 = (**(code **)((long)(pSVar6->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                            (pSVar6,*(undefined4 *)((long)pSVar4 + lVar10 + -0x14));
          core::vector3d<float>::operator+=((vector3d<float> *)(lVar8 + 0xc),&local_c8);
        }
      }
      puVar1 = &(paVar3->m_data).
                super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[*(ushort *)&in[-2].X]->field_0x1b8;
      *puVar1 = *puVar1 | 1;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x30;
    }
  }
  parentJoint_00 = (SJoint *)(lVar8 % 0x30);
  for (uVar11 = 0;
      ppSVar7 = (joint->Children).m_data.
                super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < ((ulong)((long)(joint->Children).m_data.
                              super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar7) >> 3 &
               0xffffffff); uVar11 = uVar11 + 1) {
    skinJoint(this,ppSVar7[uVar11],parentJoint_00);
    parentJoint_00 = extraout_RDX;
  }
  return;
}

Assistant:

void CSkinnedMesh::skinJoint(SJoint *joint, SJoint *parentJoint)
{
	if (joint->Weights.size()) {
		// Find this joints pull on vertices...
		core::matrix4 jointVertexPull(core::matrix4::EM4CONST_NOTHING);
		jointVertexPull.setbyproduct(joint->GlobalAnimatedMatrix, joint->GlobalInversedMatrix);

		core::vector3df thisVertexMove, thisNormalMove;

		core::array<scene::SSkinMeshBuffer *> &buffersUsed = *SkinningBuffers;

		// Skin Vertices Positions and Normals...
		for (u32 i = 0; i < joint->Weights.size(); ++i) {
			SWeight &weight = joint->Weights[i];

			// Pull this vertex...
			jointVertexPull.transformVect(thisVertexMove, weight.StaticPos);

			if (AnimateNormals)
				jointVertexPull.rotateVect(thisNormalMove, weight.StaticNormal);

			if (!(*(weight.Moved))) {
				*(weight.Moved) = true;

				buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Pos = thisVertexMove * weight.strength;

				if (AnimateNormals)
					buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Normal = thisNormalMove * weight.strength;

				//*(weight._Pos) = thisVertexMove * weight.strength;
			} else {
				buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Pos += thisVertexMove * weight.strength;

				if (AnimateNormals)
					buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Normal += thisNormalMove * weight.strength;

				//*(weight._Pos) += thisVertexMove * weight.strength;
			}

			buffersUsed[weight.buffer_id]->boundingBoxNeedsRecalculated();
		}
	}

	// Skin all children
	for (u32 j = 0; j < joint->Children.size(); ++j)
		skinJoint(joint->Children[j], joint);
}